

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_helper_unpolar<ExchCXX::BuiltinEPC17_1>
               (int N,const_host_buffer_type rho,host_buffer_type eps)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 8 != uVar1; uVar1 = uVar1 + 8) {
    lda_screening_interface<ExchCXX::BuiltinEPC17_1>::eval_exc_unpolar
              (*(double *)((long)rho + uVar1),(double *)((long)eps + uVar1));
  }
  return;
}

Assistant:

LDA_EXC_GENERATOR( host_eval_exc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    traits::eval_exc_unpolar( rho[i], eps[i] );

  }

}